

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

string * __thiscall
FileWriter::buildPath(string *__return_storage_ptr__,FileWriter *this,string *path)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  iVar3 = std::__cxx11::string::compare((char *)this);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  }
  else {
    pcVar1 = (this->prefix_)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + (this->prefix_)._M_string_length);
    std::__cxx11::string::append((char *)local_40);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(path->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileWriter::buildPath(const std::string& path) {
  if (prefix_ == ".") {
    return path;
  }
  return prefix_ + "/" + path;
}